

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

path * __thiscall ArgsManager::GetPathArg(ArgsManager *this,string *arg,path *default_value)

{
  bool bVar1;
  ulong uVar2;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ArgsManager *in_RSI;
  path *in_RDI;
  long in_FS_OFFSET;
  path result;
  string path_str;
  path *in_stack_fffffffffffffea8;
  path *this_00;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  byte bVar3;
  undefined1 in_stack_fffffffffffffedf;
  byte bVar4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  ArgsManager *in_stack_fffffffffffffee8;
  allocator<char> local_e9 [225];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = IsArgNegated(in_RSI,&in_RDI->_M_pathname);
  if (bVar1) {
    memset(in_RDI,0,0x28);
    fs::path::path((path *)in_stack_fffffffffffffea8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDX,in_RCX,(allocator<char> *)in_stack_fffffffffffffee8);
    GetArg(in_stack_fffffffffffffee8,
           (string *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
           (string *)
           CONCAT17(in_stack_fffffffffffffedf,
                    CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
    std::__cxx11::string::~string(&in_stack_fffffffffffffea8->_M_pathname);
    std::allocator<char>::~allocator(local_e9);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&in_stack_fffffffffffffea8->_M_pathname);
    if (bVar1) {
      fs::path::path((path *)in_stack_fffffffffffffea8,(path *)0x16c263);
    }
    else {
      fs::PathFromString((string *)
                         CONCAT17(in_stack_fffffffffffffedf,
                                  CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)));
      std::filesystem::__cxx11::path::lexically_normal();
      fs::path::path((path *)in_stack_fffffffffffffea8,(path *)0x16c30e);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffea8);
      fs::path::~path((path *)in_stack_fffffffffffffea8);
      uVar2 = std::filesystem::__cxx11::path::has_filename();
      bVar4 = 0;
      bVar3 = 0;
      if ((uVar2 & 1) == 0) {
        std::filesystem::__cxx11::path::parent_path();
        bVar3 = 1;
      }
      else {
        std::filesystem::__cxx11::path::path(this_00,in_RDI);
        bVar4 = 1;
      }
      fs::path::path((path *)in_stack_fffffffffffffea8,(path *)0x16c38a);
      if ((bVar3 & 1) != 0) {
        std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffea8);
      }
      if ((bVar4 & 1) != 0) {
        std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffea8);
      }
      fs::path::~path((path *)in_stack_fffffffffffffea8);
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffea8->_M_pathname);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (path *)this_00;
}

Assistant:

fs::path ArgsManager::GetPathArg(std::string arg, const fs::path& default_value) const
{
    if (IsArgNegated(arg)) return fs::path{};
    std::string path_str = GetArg(arg, "");
    if (path_str.empty()) return default_value;
    fs::path result = fs::PathFromString(path_str).lexically_normal();
    // Remove trailing slash, if present.
    return result.has_filename() ? result : result.parent_path();
}